

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

void pageant_listen_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  if (type != PLUGCLOSE_NORMAL) {
    pageant_listener_client_log((PageantListenerClient *)plug[-2].vt,"listening socket: error: %s");
  }
  (**(code **)((plug[-3].vt)->log + 8))();
  plug[-3].vt = (PlugVtable *)0x0;
  return;
}

Assistant:

static void pageant_listen_closing(Plug *plug, PlugCloseType type,
                                   const char *error_msg)
{
    struct pageant_listen_state *pl = container_of(
        plug, struct pageant_listen_state, plug);
    if (type != PLUGCLOSE_NORMAL)
        pageant_listener_client_log(pl->plc, "listening socket: error: %s",
                                    error_msg);
    sk_close(pl->listensock);
    pl->listensock = NULL;
}